

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G1.c
# Opt level: O1

void G1_makeaffine(G1 *op,ATE_CTX *ctx)

{
  fp_struct_st *op_00;
  fp_struct_st *pfVar1;
  fp_struct_st *pfVar2;
  int iVar3;
  fp_struct_st *pfVar4;
  fp_t dummy;
  fp_struct_st fStack_58;
  
  op_00 = op->m_z;
  iVar3 = fp_iszero(op_00);
  if (iVar3 != 0) {
    fp_setzero(op->m_x);
    fp_setone(op->m_y,ctx->rp);
    fp_setzero(op_00);
    return;
  }
  fp_invert(&fStack_58,op_00,ctx);
  pfVar1 = ctx->p;
  pfVar2 = ctx->n0;
  bn_mul_mont(op,op,&fStack_58,pfVar1,pfVar2,4);
  bn_mul_mont(op,op,&fStack_58,pfVar1,pfVar2,4);
  pfVar4 = op->m_y;
  bn_mul_mont(pfVar4,pfVar4,&fStack_58,pfVar1,pfVar2,4);
  bn_mul_mont(pfVar4,pfVar4,&fStack_58,pfVar1,pfVar2,4);
  bn_mul_mont(pfVar4,pfVar4,&fStack_58,pfVar1,pfVar2,4);
  fp_setone(op_00,ctx->rp);
  return;
}

Assistant:

void G1_makeaffine(G1 *op, const ATE_CTX *ctx)
{
    fp_t dummy;
    if(fp_iszero(op->m_z))
    {
        fp_setzero(op->m_x);
        fp_setone(op->m_y, ctx->rp);
        fp_setzero(op->m_z);
    }
    else
    {
        fp_invert(dummy, op->m_z, ctx);
        fp_mul(op->m_x, op->m_x, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_x, op->m_x, dummy, ctx->p, ctx->n0);

        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);
        fp_mul(op->m_y, op->m_y, dummy, ctx->p, ctx->n0);

        fp_setone(op->m_z, ctx->rp);
    }
}